

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

PgHdr * sqlite3PcacheDirtyList(PCache *pCache)

{
  PgHdr **ppPVar1;
  uint uVar2;
  PgHdr *pPVar3;
  PgHdr *pPVar4;
  PgHdr *pPVar5;
  PgHdr *pPVar6;
  long lVar7;
  PgHdr *pPVar8;
  PgHdr *pPVar9;
  long in_FS_OFFSET;
  undefined1 local_168 [56];
  undefined1 *puStack_130;
  PgHdr *local_128;
  PgHdr *pPStack_120;
  PgHdr *local_118 [32];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar5 = pCache->pDirty;
  pPVar3 = pPVar5;
  if (pPVar5 == (PgHdr *)0x0) {
    pPVar3 = (PgHdr *)0x0;
    memset(local_118,0,0x100);
  }
  else {
    do {
      pPVar8 = pPVar3->pDirtyNext;
      pPVar3->pDirty = pPVar8;
      pPVar3 = pPVar8;
    } while (pPVar8 != (PgHdr *)0x0);
    memset(local_118,0,0x100);
    pPVar3 = (PgHdr *)0x0;
joined_r0x0013b731:
    if (pPVar5 != (PgHdr *)0x0) {
      pPVar3 = pPVar5->pDirty;
      pPVar5->pDirty = (PgHdr *)0x0;
      lVar7 = 0;
      do {
        if (local_118[lVar7] == (PgHdr *)0x0) {
          local_118[lVar7] = pPVar5;
          pPVar5 = pPVar3;
          pPVar3 = local_118[0];
          goto joined_r0x0013b731;
        }
        local_128 = (PgHdr *)&DAT_aaaaaaaaaaaaaaaa;
        pPStack_120 = (PgHdr *)&DAT_aaaaaaaaaaaaaaaa;
        local_168._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
        local_168._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_168._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_168._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_168._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_168._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_168._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        pPVar8 = (PgHdr *)local_168;
        pPVar9 = local_118[lVar7];
        do {
          pPVar6 = pPVar9;
          uVar2 = pPVar6->pgno;
          while (pPVar5->pgno <= uVar2) {
            pPVar8->pDirty = pPVar5;
            ppPVar1 = &pPVar5->pDirty;
            pPVar4 = pPVar6;
            pPVar8 = pPVar5;
            pPVar5 = *ppPVar1;
            if (*ppPVar1 == (PgHdr *)0x0) goto LAB_0013b7ba;
          }
          pPVar8->pDirty = pPVar6;
          pPVar4 = pPVar5;
          pPVar8 = pPVar6;
          pPVar9 = pPVar6->pDirty;
        } while (pPVar6->pDirty != (PgHdr *)0x0);
LAB_0013b7ba:
        pPVar5 = (PgHdr *)local_168._32_8_;
        pPVar8->pDirty = pPVar4;
        local_118[lVar7] = (PgHdr *)0x0;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x1f);
      local_128 = (PgHdr *)&DAT_aaaaaaaaaaaaaaaa;
      pPStack_120 = (PgHdr *)&DAT_aaaaaaaaaaaaaaaa;
      local_168._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
      local_168._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pPVar8 = (PgHdr *)local_168;
      do {
        pPVar9 = local_118[0x1f];
        uVar2 = pPVar9->pgno;
        while (pPVar5->pgno <= uVar2) {
          pPVar8->pDirty = pPVar5;
          ppPVar1 = &pPVar5->pDirty;
          pPVar6 = pPVar9;
          pPVar8 = pPVar5;
          pPVar5 = *ppPVar1;
          if (*ppPVar1 == (PgHdr *)0x0) goto LAB_0013b842;
        }
        pPVar8->pDirty = pPVar9;
        pPVar6 = pPVar5;
        pPVar8 = pPVar9;
        local_118[0x1f] = pPVar9->pDirty;
      } while (pPVar9->pDirty != (PgHdr *)0x0);
LAB_0013b842:
      pPVar8->pDirty = pPVar6;
      local_118[0x1f] = (PgHdr *)local_168._32_8_;
      pPVar5 = pPVar3;
      pPVar3 = local_118[0];
      goto joined_r0x0013b731;
    }
  }
  lVar7 = 1;
  do {
    pPVar5 = local_118[lVar7];
    pPVar8 = pPVar3;
    if ((pPVar5 != (PgHdr *)0x0) && (pPVar8 = pPVar5, pPVar3 != (PgHdr *)0x0)) {
      local_128 = (PgHdr *)&DAT_aaaaaaaaaaaaaaaa;
      pPStack_120 = (PgHdr *)&DAT_aaaaaaaaaaaaaaaa;
      local_168._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
      local_168._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pPVar8 = (PgHdr *)local_168;
      do {
        pPVar9 = pPVar3;
        uVar2 = pPVar9->pgno;
        while (pPVar5->pgno <= uVar2) {
          pPVar8->pDirty = pPVar5;
          ppPVar1 = &pPVar5->pDirty;
          pPVar6 = pPVar9;
          pPVar8 = pPVar5;
          pPVar5 = *ppPVar1;
          if (*ppPVar1 == (PgHdr *)0x0) goto LAB_0013b8ef;
        }
        pPVar8->pDirty = pPVar9;
        pPVar6 = pPVar5;
        pPVar3 = pPVar9->pDirty;
        pPVar8 = pPVar9;
      } while (pPVar9->pDirty != (PgHdr *)0x0);
LAB_0013b8ef:
      pPVar8->pDirty = pPVar6;
      pPVar8 = (PgHdr *)local_168._32_8_;
    }
    lVar7 = lVar7 + 1;
    pPVar3 = pPVar8;
    if (lVar7 == 0x20) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
        __stack_chk_fail();
      }
      return pPVar8;
    }
  } while( true );
}

Assistant:

SQLITE_PRIVATE PgHdr *sqlite3PcacheDirtyList(PCache *pCache){
  PgHdr *p;
  for(p=pCache->pDirty; p; p=p->pDirtyNext){
    p->pDirty = p->pDirtyNext;
  }
  return pcacheSortDirtyList(pCache->pDirty);
}